

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void plain_array_suite::assign_initializer_list(void)

{
  initializer_list<int> __l;
  initializer_list<int> input;
  initializer_list<int> __l_00;
  initializer_list<int> input_00;
  initializer_list<int> __l_01;
  initializer_list<int> input_01;
  initializer_list<int> __l_02;
  initializer_list<int> input_02;
  initializer_list<int> __l_03;
  initializer_list<int> input_03;
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  allocator<int> local_2c1;
  int local_2c0 [4];
  iterator local_2b0;
  size_type local_2a8;
  undefined1 local_2a0 [8];
  vector<int,_std::allocator<int>_> expect_4;
  allocator<int> local_221;
  int local_220 [4];
  iterator local_210;
  size_type local_208;
  undefined1 local_200 [8];
  vector<int,_std::allocator<int>_> expect_3;
  allocator<int> local_195;
  int local_194 [3];
  iterator local_188;
  size_type local_180;
  undefined1 local_178 [8];
  vector<int,_std::allocator<int>_> expect_2;
  allocator<int> local_109;
  int local_108 [2];
  iterator local_100;
  size_type local_f8;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> expect_1;
  allocator<int> local_7d;
  int local_7c;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> expect;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xb;
  input_03._M_len = 1;
  input_03._M_array =
       (iterator)
       ((long)&expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 4);
  vista::circular_view<int,_18446744073709551615UL>::assign
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_03);
  local_7c = 0xb;
  local_78 = &local_7c;
  local_70 = 1;
  std::allocator<int>::allocator(&local_7d);
  __l_03._M_len = local_70;
  __l_03._M_array = local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_03,&local_7d);
  std::allocator<int>::~allocator(&local_7d);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_68);
  iVar2 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_68)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x787,"void plain_array_suite::assign_initializer_list()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x15;
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x16;
  input_02._M_len = 2;
  input_02._M_array =
       (iterator)
       &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::assign
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_02);
  local_108[0] = 0x15;
  local_108[1] = 0x16;
  local_100 = local_108;
  local_f8 = 2;
  std::allocator<int>::allocator(&local_109);
  __l_02._M_len = local_f8;
  __l_02._M_array = local_100;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f0,__l_02,&local_109);
  std::allocator<int>::~allocator(&local_109);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_f0);
  iVar2 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_f0)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x78d,"void plain_array_suite::assign_initializer_list()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0);
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x1f;
  input_01._M_len = 3;
  input_01._M_array =
       (iterator)
       ((long)&expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4);
  vista::circular_view<int,_18446744073709551615UL>::assign
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_01);
  local_194[0] = 0x1f;
  local_194[1] = 0x20;
  local_194[2] = 0x21;
  local_188 = local_194;
  local_180 = 3;
  std::allocator<int>::allocator(&local_195);
  __l_01._M_len = local_180;
  __l_01._M_array = local_188;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_178,__l_01,&local_195);
  std::allocator<int>::~allocator(&local_195);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_178);
  iVar2 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_178);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x793,"void plain_array_suite::assign_initializer_list()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_178);
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x29;
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x2a;
  input_00._M_len = 4;
  input_00._M_array =
       (iterator)
       &expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::assign
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_00);
  local_220[0] = 0x29;
  local_220[1] = 0x2a;
  local_220[2] = 0x2b;
  local_220[3] = 0x2c;
  local_210 = local_220;
  local_208 = 4;
  std::allocator<int>::allocator(&local_221);
  __l_00._M_len = local_208;
  __l_00._M_array = local_210;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_200,__l_00,&local_221);
  std::allocator<int>::~allocator(&local_221);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_200);
  iVar2 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_200);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x799,"void plain_array_suite::assign_initializer_list()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_200);
  expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3400000033;
  input._M_len = 5;
  input._M_array =
       (iterator)
       &expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::assign
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  local_2c0[0] = 0x34;
  local_2c0[1] = 0x35;
  local_2c0[2] = 0x36;
  local_2c0[3] = 0x37;
  local_2b0 = local_2c0;
  local_2a8 = 4;
  std::allocator<int>::allocator(&local_2c1);
  __l._M_len = local_2a8;
  __l._M_array = local_2b0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_2a0,__l,&local_2c1);
  std::allocator<int>::~allocator(&local_2c1);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_2a0);
  iVar2 = std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)local_2a0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x79f,"void plain_array_suite::assign_initializer_list()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_2a0);
  return;
}

Assistant:

void assign_initializer_list()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.assign({ 11 });
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.assign({ 21, 22 });
    {
        std::vector<int> expect = { 21, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.assign({ 31, 32, 33 });
    {
        std::vector<int> expect = { 31, 32, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.assign({ 41, 42, 43, 44 });
    {
        std::vector<int> expect = { 41, 42, 43, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.assign({ 51, 52, 53, 54, 55 });
    {
        std::vector<int> expect = { 52, 53, 54, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}